

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

void SUNMatDestroy_Dense(SUNMatrix A)

{
  void *pvVar1;
  
  if (A != (SUNMatrix)0x0) {
    if (A->content != (void *)0x0) {
      pvVar1 = *(void **)((long)A->content + 8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)A->content + 8) = 0;
      }
      pvVar1 = *(void **)((long)A->content + 0x18);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)A->content + 0x18) = 0;
      }
      free(A->content);
      A->content = (void *)0x0;
    }
    if (A->ops != (SUNMatrix_Ops)0x0) {
      free(A->ops);
      A->ops = (SUNMatrix_Ops)0x0;
    }
    free(A);
    return;
  }
  return;
}

Assistant:

void SUNMatDestroy_Dense(SUNMatrix A)
{
  if (A == NULL) return;

  /* free content */
  if (A->content != NULL) {
    /* free data array */
    if (SM_DATA_D(A) != NULL) {
      free(SM_DATA_D(A));
      SM_DATA_D(A) = NULL;
    }
    /* free column pointers */
    if (SM_CONTENT_D(A)->cols != NULL) {
      free(SM_CONTENT_D(A)->cols);
      SM_CONTENT_D(A)->cols = NULL;
    }
    /* free content struct */
    free(A->content);
    A->content = NULL;
  }

  /* free ops and matrix */
  if (A->ops) { free(A->ops); A->ops = NULL; }
  free(A); A = NULL;

  return;
}